

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::LowerInclusiveBetweenOperator,false,true,true>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  sel_t *psVar8;
  sel_t *psVar9;
  long lVar10;
  bool bVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  idx_t iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  
  if (count == 0) {
    iVar19 = 0;
  }
  else {
    psVar1 = result_sel->sel_vector;
    psVar2 = asel->sel_vector;
    psVar3 = bsel->sel_vector;
    psVar4 = csel->sel_vector;
    puVar5 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar6 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar7 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    psVar8 = true_sel->sel_vector;
    psVar9 = false_sel->sel_vector;
    iVar19 = 0;
    lVar18 = 0;
    uVar17 = 0;
    do {
      uVar20 = uVar17;
      if (psVar1 != (sel_t *)0x0) {
        uVar20 = (ulong)psVar1[uVar17];
      }
      uVar12 = uVar17;
      if (psVar2 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar2[uVar17];
      }
      uVar13 = uVar17;
      if (psVar3 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar3[uVar17];
      }
      uVar16 = uVar17;
      if (psVar4 != (sel_t *)0x0) {
        uVar16 = (ulong)psVar4[uVar17];
      }
      if ((((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0))
          && ((puVar6 == (unsigned_long *)0x0 || ((puVar6[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)
              ))) &&
         ((puVar7 == (unsigned_long *)0x0 || ((puVar7[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0))))
      {
        lVar24._0_4_ = adata[uVar12].months;
        lVar24._4_4_ = adata[uVar12].days;
        lVar15._0_4_ = bdata[uVar13].months;
        lVar15._4_4_ = bdata[uVar13].days;
        lVar14 = (lVar15 >> 0x20) + bdata[uVar13].micros / 86400000000;
        lVar21 = lVar14 % 0x1e;
        lVar14 = (long)(int)(undefined4)lVar15 + lVar14 / 0x1e;
        lVar15 = (lVar24 >> 0x20) + adata[uVar12].micros / 86400000000;
        lVar22 = adata[uVar12].micros % 86400000000;
        lVar23 = lVar15 % 0x1e;
        lVar24 = (long)(int)(undefined4)lVar24 + lVar15 / 0x1e;
        if (lVar24 < lVar14) {
          bVar11 = false;
        }
        else {
          lVar10._0_4_ = cdata[uVar16].months;
          lVar10._4_4_ = cdata[uVar16].days;
          if ((lVar14 < lVar24) ||
             ((lVar21 <= lVar23 &&
              ((lVar21 < lVar23 || (bdata[uVar13].micros % 86400000000 <= lVar22)))))) {
            lVar14 = (lVar10 >> 0x20) + cdata[uVar16].micros / 86400000000;
            lVar15 = (long)(int)(undefined4)lVar10 + lVar14 / 0x1e;
            bVar11 = true;
            if (lVar15 <= lVar24) {
              if (lVar15 < lVar24) {
                bVar11 = false;
              }
              else {
                lVar14 = lVar14 % 0x1e;
                bVar11 = true;
                if (lVar14 <= lVar23) {
                  bVar11 = lVar22 < cdata[uVar16].micros % 86400000000 && lVar23 <= lVar14;
                }
              }
            }
          }
          else {
            bVar11 = false;
          }
        }
      }
      else {
        bVar11 = false;
      }
      psVar8[iVar19] = (sel_t)uVar20;
      iVar19 = iVar19 + bVar11;
      psVar9[lVar18] = (sel_t)uVar20;
      lVar18 = lVar18 + (ulong)(bVar11 ^ 1);
      uVar17 = uVar17 + 1;
    } while (count != uVar17);
  }
  return iVar19;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}